

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O3

int amqp_messenger_stop(AMQP_MESSENGER_HANDLE messenger_handle)

{
  AMQP_MESSENGER_STATE AVar1;
  AMQP_MESSENGER_CONFIG *pAVar2;
  int iVar3;
  LOGGER_LOG p_Var4;
  int iVar5;
  AMQP_MESSENGER_STATE previous_state;
  char *pcVar6;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    p_Var4 = xlogging_get_log_function();
    iVar3 = 0x4cc;
    if (p_Var4 == (LOGGER_LOG)0x0) {
      return 0x4cc;
    }
    pcVar6 = "Invalid argument (messenger_handle is NULL)";
    iVar5 = 0x4cd;
LAB_0013c4cd:
    (*p_Var4)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
              ,"amqp_messenger_stop",iVar5,1,pcVar6);
  }
  else {
    AVar1 = messenger_handle->state;
    if (AVar1 != AMQP_MESSENGER_STATE_STOPPING) {
      if (AVar1 == AMQP_MESSENGER_STATE_STOPPED) {
        p_Var4 = xlogging_get_log_function();
        iVar3 = 0x4d5;
        if (p_Var4 == (LOGGER_LOG)0x0) {
          return 0x4d5;
        }
        pcVar6 = "amqp_messenger_stop failed (messenger is already stopped)";
        iVar5 = 0x4d6;
        goto LAB_0013c4cd;
      }
      messenger_handle->state = AMQP_MESSENGER_STATE_STOPPING;
      pAVar2 = messenger_handle->config;
      if ((pAVar2 != (AMQP_MESSENGER_CONFIG *)0x0) &&
         (pAVar2->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
        (*pAVar2->on_state_changed_callback)
                  (pAVar2->on_state_changed_context,AVar1,AMQP_MESSENGER_STATE_STOPPING);
      }
    }
    destroy_message_sender(messenger_handle);
    destroy_message_receiver(messenger_handle);
    iVar3 = message_queue_move_all_back_to_pending(messenger_handle->send_queue);
    if (iVar3 == 0) {
      AVar1 = messenger_handle->state;
      if (AVar1 != AMQP_MESSENGER_STATE_STOPPED) {
        messenger_handle->state = AMQP_MESSENGER_STATE_STOPPED;
        pAVar2 = messenger_handle->config;
        if ((pAVar2 != (AMQP_MESSENGER_CONFIG *)0x0) &&
           (pAVar2->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
          (*pAVar2->on_state_changed_callback)
                    (pAVar2->on_state_changed_context,AVar1,AMQP_MESSENGER_STATE_STOPPED);
        }
      }
      messenger_handle->send_error_count = 0;
      iVar3 = 0;
    }
    else {
      p_Var4 = xlogging_get_log_function();
      if (p_Var4 != (LOGGER_LOG)0x0) {
        (*p_Var4)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                  ,"amqp_messenger_stop",0x4e1,1,
                  "Messenger failed to move events in progress back to wait_to_send list");
      }
      AVar1 = messenger_handle->state;
      iVar3 = 0x4e4;
      if (AVar1 != AMQP_MESSENGER_STATE_ERROR) {
        messenger_handle->state = AMQP_MESSENGER_STATE_ERROR;
        pAVar2 = messenger_handle->config;
        if ((pAVar2 != (AMQP_MESSENGER_CONFIG *)0x0) &&
           (pAVar2->on_state_changed_callback != (AMQP_MESSENGER_STATE_CHANGED_CALLBACK)0x0)) {
          (*pAVar2->on_state_changed_callback)
                    (pAVar2->on_state_changed_context,AVar1,AMQP_MESSENGER_STATE_ERROR);
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int amqp_messenger_stop(AMQP_MESSENGER_HANDLE messenger_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state == AMQP_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("amqp_messenger_stop failed (messenger is already stopped)");
        }
        else
        {
            update_messenger_state(instance, AMQP_MESSENGER_STATE_STOPPING);

            destroy_message_sender(instance);
            destroy_message_receiver(instance);

            if (message_queue_move_all_back_to_pending(instance->send_queue) != RESULT_OK)
            {
                LogError("Messenger failed to move events in progress back to wait_to_send list");

                update_messenger_state(instance, AMQP_MESSENGER_STATE_ERROR);
                result = MU_FAILURE;
            }
            else
            {
                update_messenger_state(instance, AMQP_MESSENGER_STATE_STOPPED);

                instance->send_error_count = 0;

                result = RESULT_OK;
            }
        }
    }

    return result;
}